

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O3

int Mpm_ObjAddCutToStore(Mpm_Man_t *p,Mpm_Cut_t *pCut,int ArrTime)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Mpm_Uni_t *pMVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  Mpm_Par_t *pMVar12;
  Mpm_Uni_t *pMVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int *piVar17;
  void **ppvVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  
  lVar16 = (long)(p->vFreeUnits).nSize;
  if (lVar16 < 1) goto LAB_00483c3e;
  pMVar6 = (Mpm_Uni_t *)(p->vFreeUnits).pArray[lVar16 + -1];
  if (&pMVar6->pCut != pCut) {
    __assert_fail("&pUnit->pCut == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xb8,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  piVar7 = (p->vMigRefs).pArray;
  piVar8 = (p->vMapRefs).pArray;
  piVar9 = (p->vEstRefs).pArray;
  piVar10 = (p->vAreas).pArray;
  piVar11 = (p->vEdges).pArray;
  pMVar6->mTime = ArrTime;
  pMVar12 = p->pPars;
  if (pMVar12->fMap4Cnf == 0) {
    if (pMVar12->fMap4Aig != 0) {
      iVar15 = *(int *)((long)&p->pDsd6->nAnds +
                       (ulong)((*(uint *)&pCut->field_0x4 & 0x1fffffe) << 4));
      goto LAB_004836df;
    }
    iVar15 = 0x14;
    if (pMVar12->fMap4Gates == 0) {
      iVar15 = p->pLibLut->pLutAreas[*(uint *)&pCut->field_0x4 >> 0x1b];
    }
  }
  else {
    iVar15 = *(int *)((long)&p->pDsd6->nClauses +
                     (ulong)((*(uint *)&pCut->field_0x4 & 0x1fffffe) << 4));
LAB_004836df:
    iVar15 = iVar15 * 0x14;
  }
  pMVar6->mArea = iVar15;
  iVar27 = (*(uint *)&pCut->field_0x4 >> 0x1b) * 0x32;
  pMVar6->mEdge = iVar27;
  *(undefined8 *)&pMVar6->mAveRefs = 0;
  *(undefined8 *)((long)&pMVar6->uSign + 4) = 0;
  if (*(uint *)&pCut->field_0x4 < 0x8000000) {
    uVar22 = *(uint *)&pCut->field_0x4 >> 0x1b;
    iVar14 = 0;
  }
  else {
    uVar23 = 0;
    iVar14 = 0;
    uVar26 = 0;
    do {
      if (pCut->pLeaves[uVar26] < 0) {
LAB_00483c00:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar24 = (ulong)((uint)pCut->pLeaves[uVar26] >> 1);
      iVar25 = p->fMainRun;
      if ((iVar25 == 0) || (piVar8[uVar24] != 0)) {
        iVar2 = piVar9[uVar24];
        if (iVar2 < 1) {
          __assert_fail("pEstRefs[iLeaf] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                        ,200,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
        }
        iVar15 = iVar15 + (piVar10[uVar24] * 100) / iVar2;
        pMVar6->mArea = iVar15;
        iVar27 = iVar27 + (piVar11[uVar24] * 100) / piVar9[uVar24];
        piVar17 = piVar8;
        if (iVar25 == 0) {
          piVar17 = piVar7;
        }
        pMVar6->mEdge = iVar27;
        iVar14 = iVar14 + piVar17[uVar24];
        pMVar6->mAveRefs = iVar14;
      }
      else {
        iVar15 = iVar15 + piVar10[uVar24];
        pMVar6->mArea = iVar15;
        iVar27 = iVar27 + piVar11[uVar24];
        pMVar6->mEdge = iVar27;
      }
      uVar23 = uVar23 | 1L << (uVar24 & 0x3f);
      pMVar6->uSign = uVar23;
      uVar26 = uVar26 + 1;
      uVar22 = *(uint *)&pCut->field_0x4 >> 0x1b;
    } while (uVar26 < uVar22);
    iVar14 = iVar14 * 0x32;
  }
  pMVar6->mAveRefs = iVar14 / (int)(uVar22 + (uVar22 == 0));
  if (0x3fffffff < ArrTime) {
    __assert_fail("pUnit->mTime <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xd0,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  if (0x3fffffff < iVar15) {
    __assert_fail("pUnit->mArea <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xd1,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  if (0x3fffffff < iVar27) {
    __assert_fail("pUnit->mEdge <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xd2,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  uVar22 = p->nCutStore;
  if ((long)(int)uVar22 == 0) {
    p->nCutStore = 1;
    p->pCutStore[0] = pMVar6;
    iVar15 = (p->vFreeUnits).nSize;
    if (iVar15 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    (p->vFreeUnits).nSize = iVar15 + -1;
  }
  else {
    iVar15 = p->nNumCuts;
    if (uVar22 == iVar15 - 1U) {
      iVar15 = (*p->pCutCmp)(pMVar6,p->pCutStore[(long)(int)uVar22 + -1]);
      if (0 < iVar15) {
        return 0;
      }
      iVar15 = p->nNumCuts;
      uVar22 = p->nCutStore;
    }
    if (iVar15 < (int)uVar22) {
      __assert_fail("p->nCutStore <= p->nNumCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                    ,0xfb,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    uVar26 = (ulong)uVar22;
    uVar22 = (int)uVar22 >> 0x1f & uVar22;
    lVar16 = uVar26 + 1;
    do {
      if ((int)uVar26 < 1) goto LAB_00483954;
      lVar20 = uVar26 - 1;
      uVar26 = uVar26 - 1;
      iVar15 = (*p->pCutCmp)(pMVar6,p->pCutStore[lVar20]);
      lVar16 = lVar16 + -1;
    } while (iVar15 < 1);
    uVar3 = *(uint *)&(pMVar6->pCut).field_0x4;
    uVar19 = uVar3 >> 0x1b;
    uVar22 = (uint)lVar16;
    uVar26 = 0;
    do {
      pMVar13 = p->pCutStore[uVar26];
      uVar21 = *(uint *)&(pMVar13->pCut).field_0x4;
      uVar5 = uVar21 >> 0x1b;
      if ((uVar5 <= uVar19) && ((pMVar13->uSign & ~pMVar6->uSign) == 0)) {
        if (uVar21 < 0x8000000) {
          return 0;
        }
        uVar23 = 0;
        while( true ) {
          uVar21 = (pMVar13->pCut).pLeaves[uVar23];
          if ((int)uVar21 < 0) goto LAB_00483c00;
          uVar24 = 0;
          if (0x7ffffff < uVar3) {
            uVar24 = 0;
            while( true ) {
              uVar4 = (pMVar6->pCut).pLeaves[uVar24];
              if ((int)uVar4 < 0) goto LAB_00483c00;
              if ((uVar4 ^ uVar21) < 2) break;
              uVar24 = uVar24 + 1;
              if (uVar19 == uVar24) goto LAB_00483945;
            }
          }
          if ((uint)uVar24 == uVar19) break;
          uVar23 = uVar23 + 1;
          if (uVar23 == uVar5) {
            return 0;
          }
        }
      }
LAB_00483945:
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uVar22 & 0x7fffffff));
LAB_00483954:
    if (((p->pCutStore[0]->pCut).field_0x7 & 4) != 0) {
      uVar22 = (*(int *)&(pMVar6->pCut).field_0x4 << 5) >> 0x1f & uVar22;
    }
    iVar15 = (p->vFreeUnits).nSize;
    if ((long)iVar15 < 1) {
LAB_00483c3e:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
    }
    if (pMVar6 != (Mpm_Uni_t *)(p->vFreeUnits).pArray[(long)iVar15 + -1]) {
      __assert_fail("pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                    ,0x11a,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    iVar15 = iVar15 + -1;
    (p->vFreeUnits).nSize = iVar15;
    iVar27 = p->nCutStore;
    lVar16 = (long)iVar27;
    iVar14 = iVar27 + 1;
    p->nCutStore = iVar14;
    if ((int)uVar22 < iVar27) {
      do {
        p->pCutStore[lVar16] = p->pCutStore[lVar16 + -1];
        lVar16 = lVar16 + -1;
      } while ((int)uVar22 < lVar16);
    }
    p->pCutStore[(int)uVar22] = pMVar6;
    iVar25 = uVar22 + 1;
    if ((int)uVar22 < iVar27) {
      lVar16 = (long)iVar25;
      do {
        pMVar13 = p->pCutStore[lVar16];
        uVar22 = *(uint *)&(pMVar6->pCut).field_0x4;
        uVar19 = uVar22 >> 0x1b;
        uVar3 = *(uint *)&(pMVar13->pCut).field_0x4;
        uVar21 = uVar3 >> 0x1b;
        if ((uVar21 < uVar19) || ((pMVar6->uSign & ~pMVar13->uSign) != 0)) {
LAB_00483a93:
          lVar20 = (long)iVar25;
          iVar25 = iVar25 + 1;
          p->pCutStore[lVar20] = pMVar13;
        }
        else {
          if (0x7ffffff < uVar22) {
            uVar26 = 0;
            do {
              uVar22 = (pMVar6->pCut).pLeaves[uVar26];
              if ((int)uVar22 < 0) goto LAB_00483c00;
              uVar23 = 0;
              if (0x7ffffff < uVar3) {
                uVar23 = 0;
                while( true ) {
                  uVar5 = (pMVar13->pCut).pLeaves[uVar23];
                  if ((int)uVar5 < 0) goto LAB_00483c00;
                  if ((uVar5 ^ uVar22) < 2) break;
                  uVar23 = uVar23 + 1;
                  if (uVar21 == uVar23) goto LAB_00483a93;
                }
              }
              if ((uint)uVar23 == uVar21) goto LAB_00483a93;
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar19);
          }
          if (iVar15 == (p->vFreeUnits).nCap) {
            if (iVar15 < 0x10) {
              ppvVar18 = (p->vFreeUnits).pArray;
              if (ppvVar18 == (void **)0x0) {
                ppvVar18 = (void **)malloc(0x80);
              }
              else {
                ppvVar18 = (void **)realloc(ppvVar18,0x80);
              }
              (p->vFreeUnits).pArray = ppvVar18;
              (p->vFreeUnits).nCap = 0x10;
            }
            else {
              ppvVar18 = (p->vFreeUnits).pArray;
              sVar1 = (ulong)(uint)(iVar15 * 2) * 8;
              if (ppvVar18 == (void **)0x0) {
                ppvVar18 = (void **)malloc(sVar1);
              }
              else {
                ppvVar18 = (void **)realloc(ppvVar18,sVar1);
              }
              (p->vFreeUnits).pArray = ppvVar18;
              (p->vFreeUnits).nCap = iVar15 * 2;
            }
          }
          else {
            ppvVar18 = (p->vFreeUnits).pArray;
          }
          iVar27 = (p->vFreeUnits).nSize;
          iVar15 = iVar27 + 1;
          (p->vFreeUnits).nSize = iVar15;
          ppvVar18[iVar27] = pMVar13;
          iVar14 = p->nCutStore;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar14);
    }
    p->nCutStore = iVar25;
    iVar27 = p->nNumCuts;
    if (iVar25 == iVar27) {
      p->nCutStore = iVar25 + -1;
      pMVar6 = p->pCutStore[(long)iVar25 + -1];
      if (iVar15 == (p->vFreeUnits).nCap) {
        if (iVar15 < 0x10) {
          ppvVar18 = (p->vFreeUnits).pArray;
          if (ppvVar18 == (void **)0x0) {
            ppvVar18 = (void **)malloc(0x80);
          }
          else {
            ppvVar18 = (void **)realloc(ppvVar18,0x80);
          }
          (p->vFreeUnits).pArray = ppvVar18;
          (p->vFreeUnits).nCap = 0x10;
        }
        else {
          ppvVar18 = (p->vFreeUnits).pArray;
          sVar1 = (ulong)(uint)(iVar15 * 2) * 8;
          if (ppvVar18 == (void **)0x0) {
            ppvVar18 = (void **)malloc(sVar1);
          }
          else {
            ppvVar18 = (void **)realloc(ppvVar18,sVar1);
          }
          (p->vFreeUnits).pArray = ppvVar18;
          (p->vFreeUnits).nCap = iVar15 * 2;
        }
      }
      else {
        ppvVar18 = (p->vFreeUnits).pArray;
      }
      iVar15 = (p->vFreeUnits).nSize;
      (p->vFreeUnits).nSize = iVar15 + 1;
      ppvVar18[iVar15] = pMVar6;
      iVar27 = p->nNumCuts;
      iVar25 = p->nCutStore;
    }
    if (iVar27 <= iVar25) {
      __assert_fail("p->nCutStore < p->nNumCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                    ,0x13b,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
  }
  return 1;
}

Assistant:

int Mpm_ObjAddCutToStore( Mpm_Man_t * p, Mpm_Cut_t * pCut, int ArrTime )
{
    int fEnableContainment = 1;
    Mpm_Uni_t * pUnit, * pUnitNew;
    int k, iPivot, last;
    // create new unit
#ifdef MIG_RUNTIME
    abctime clk;
clk = Abc_Clock();
#endif
    pUnitNew = Mpm_CutSetupInfo( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeEval += Abc_Clock() - clk;
#endif
    // special case when the cut store is empty
    if ( p->nCutStore == 0 )
    {
        p->pCutStore[p->nCutStore++] = pUnitNew;
        Vec_PtrPop( &p->vFreeUnits );
        return 1;
    }
    // special case when the cut store is full and last cut is better than new cut
    if ( p->nCutStore == p->nNumCuts-1 && p->pCutCmp(pUnitNew, p->pCutStore[p->nCutStore-1]) > 0 )
        return 0;

    // find place of the given cut in the store
    assert( p->nCutStore <= p->nNumCuts );
    for ( iPivot = p->nCutStore - 1; iPivot >= 0; iPivot-- )
        if ( p->pCutCmp(pUnitNew, p->pCutStore[iPivot]) > 0 ) // iPivot-th cut is better than new cut
            break;

    if ( fEnableContainment )
    {
#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
        // filter this cut using other cuts
        for ( k = 0; k <= iPivot; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves >= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnit->uSign && 
                 Mpm_CutIsContained(p, &pUnitNew->pCut, &pUnit->pCut) )
            {
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
                return 0;
            }
        }
    }

    // special case when the best cut is useless while the new cut is not
    if ( p->pCutStore[0]->pCut.fUseless && !pUnitNew->pCut.fUseless )
        iPivot = -1;

    // add the cut to storage
    assert( pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits) );
    Vec_PtrPop( &p->vFreeUnits );

    // insert this cut at location iPivot
    iPivot++;
    for ( k = p->nCutStore++; k > iPivot; k-- )
        p->pCutStore[k] = p->pCutStore[k-1];
    p->pCutStore[iPivot] = pUnitNew;

    if ( fEnableContainment )
    {
        // filter other cuts using this cut
        for ( k = last = iPivot+1; k < p->nCutStore; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves <= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnitNew->uSign && 
                 Mpm_CutIsContained(p, &pUnit->pCut, &pUnitNew->pCut) )
            {
                Vec_PtrPush( &p->vFreeUnits, pUnit );
                continue;
            }
            p->pCutStore[last++] = p->pCutStore[k];
        }
        p->nCutStore = last;
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
    }

    // remove the last cut if too many
    if ( p->nCutStore == p->nNumCuts )
        Vec_PtrPush( &p->vFreeUnits, p->pCutStore[--p->nCutStore] );
    assert( p->nCutStore < p->nNumCuts );
    return 1;
}